

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O3

string * escape_string(string *__return_storage_ptr__,string *s)

{
  byte bVar1;
  int iVar2;
  char cVar3;
  byte *pbVar4;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (s->_M_string_length != 0) {
    pbVar4 = (byte *)(s->_M_dataplus)._M_p;
    do {
      bVar1 = *pbVar4;
      if (0x21 < bVar1) {
        if (((bVar1 != 0x22) && (bVar1 != 0x27)) && (bVar1 != 0x5c)) goto switchD_001533bf_caseD_b;
        goto LAB_0015340a;
      }
      switch(bVar1) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      default:
switchD_001533bf_caseD_b:
        iVar2 = isprint((int)(char)bVar1);
        if (iVar2 == 0) {
          cVar3 = (char)__return_storage_ptr__;
          std::__cxx11::string::push_back(cVar3);
          std::__cxx11::string::push_back(cVar3);
          std::__cxx11::string::push_back(cVar3);
          std::__cxx11::string::push_back(cVar3);
        }
        else {
          local_58[0] = local_48;
          std::__cxx11::string::_M_construct((ulong)local_58,'\x01');
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_58[0]);
          if (local_58[0] != local_48) {
            operator_delete(local_58[0]);
          }
        }
        goto LAB_00153412;
      case 0xd:
      }
LAB_0015340a:
      std::__cxx11::string::append((char *)__return_storage_ptr__);
LAB_00153412:
      pbVar4 = pbVar4 + 1;
    } while (pbVar4 != (byte *)((s->_M_dataplus)._M_p + s->_M_string_length));
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string escape_string(const std::string &s) {
    const char *hex_digits = "0123456789abcdef";
    std::string result;

    for (auto it = s.begin(); it != s.end(); ++it) {
        char ch = *it;

        if (ch == '\\') {
            result += "\\\\";
        } else if (ch == '\'') {
            result += "\\\'";
        } else if (ch == '\"') {
            result += "\\\"";
        } else if (ch == '\b') {
            result += "\\b";
        } else if (ch == '\t') {
            result += "\\t";
        } else if (ch == '\r') {
            result += "\\r";
        } else if (ch == '\n') {
            result += "\\n";
        } else if (std::isprint(ch)) {
            result += std::string(1, ch);
        } else {
            result.push_back('\\');
            result.push_back('x');
            result.push_back(hex_digits[static_cast<unsigned char>(ch) / 16]);
            result.push_back(hex_digits[static_cast<unsigned char>(ch) % 16]);
        }
    }

    return result;
}